

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_panel_bmod.h
# Opt level: O3

void __thiscall
Eigen::internal::SparseLUImpl<double,_int>::panel_bmod
          (SparseLUImpl<double,_int> *this,int m,int w,int jcol,int nseg,ScalarVector *dense,
          ScalarVector *tempv,IndexVector *segrep,IndexVector *repfnz,GlobalLU_t *glu)

{
  Matrix<double,__1,_1,_0,__1,_1> *lusup;
  Matrix<int,__1,_1,_0,__1,_1> *lsub;
  double *pdVar1;
  int iVar2;
  int iVar3;
  int lptr;
  int iVar4;
  int iVar5;
  Nested pMVar6;
  double *pdVar7;
  int *piVar8;
  int *piVar9;
  double *pdVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  int *piVar17;
  PointerType pdVar18;
  char *pcVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  double *__s;
  int iVar24;
  uint nrow;
  long lVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  PointerType pdVar32;
  int iVar33;
  long lVar34;
  uint uVar35;
  long lVar36;
  double *pdVar37;
  long lVar38;
  int iVar39;
  PointerType d;
  PointerType pdVar40;
  long lVar41;
  double *local_1b0;
  PointerType local_1a8;
  PointerType local_1a0;
  long local_198;
  long local_188;
  long local_180;
  long local_178;
  ulong local_170;
  undefined1 local_168 [8];
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> dense_col;
  double *pdStack_138;
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_> U;
  Index outerSize;
  Index innerSize;
  int luptr;
  
  iVar11 = jcol + w;
  iVar24 = iVar11;
  if (iVar11 < jcol) {
    iVar24 = jcol;
  }
  if (0 < nseg) {
    pdVar40 = (PointerType)(long)m;
    lusup = &glu->lusup;
    lsub = &glu->lsub;
    lVar20 = (long)jcol;
    lVar21 = (long)iVar11;
    local_188 = (long)iVar24;
    local_180 = -(long)pdVar40;
    U.m_stride.super_Stride<_1,_0>._8_8_ = (long)pdVar40 * 4;
    local_178 = (long)pdVar40 * 8;
    iVar24 = 0;
    uVar22 = (ulong)(uint)nseg;
    innerSize._4_4_ = m;
    do {
      if (((long)uVar22 < 1) ||
         ((segrep->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
          (long)uVar22)) {
LAB_0014f1ec:
        pcVar19 = 
        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
        ;
        goto LAB_0014f218;
      }
      uVar22 = uVar22 - 1;
      iVar2 = (segrep->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_data
              [uVar22];
      lVar28 = (long)iVar2;
      if ((lVar28 < 0) ||
         ((((glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows <= lVar28 ||
           (lVar15 = (long)(glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data[lVar28], lVar15 < 0)) ||
          ((glu->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
           <= lVar15)))) goto LAB_0014f1ec;
      iVar3 = (glu->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
              m_data[lVar15];
      uVar30 = (ulong)iVar3;
      if ((long)uVar30 < -1) goto LAB_0014f1ec;
      lVar15 = uVar30 + 1;
      uVar16 = (glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      if (((long)uVar16 <= lVar15) || (uVar16 <= uVar30)) goto LAB_0014f1ec;
      uVar12 = iVar2 - iVar3;
      piVar17 = (glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                m_data;
      lptr = piVar17[uVar30];
      nrow = (~uVar12 + piVar17[uVar30 + 1]) - lptr;
      local_170 = uVar22;
      if (w < 1) {
        uVar23 = 0;
        d = (PointerType)0x0;
        if (0 < (int)uVar12) goto LAB_0014e994;
      }
      else {
        piVar17 = (repfnz->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data;
        uVar22 = 0;
        uVar23 = 0;
        d = (PointerType)0x0;
        lVar31 = lVar20;
        do {
          if (piVar17 != (int *)0x0 && innerSize._4_4_ < 0) goto LAB_0014f26f;
          if (((long)(uVar22 | (ulong)pdVar40) < 0) ||
             ((repfnz->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              - (long)pdVar40 < (long)uVar22)) goto LAB_0014f258;
          if (innerSize._4_4_ <= iVar2) goto LAB_0014f241;
          if (piVar17[lVar28] != -1) {
            uVar35 = (iVar2 + 1) - piVar17[lVar28];
            uVar23 = uVar23 + 1;
            if ((int)d < (int)uVar35) {
              d = (PointerType)(ulong)uVar35;
            }
          }
          lVar31 = lVar31 + 1;
          piVar17 = (int *)((long)piVar17 + U.m_stride.super_Stride<_1,_0>._8_8_);
          uVar22 = uVar22 + (long)pdVar40;
        } while (lVar31 < lVar21);
        if (0 < (int)uVar12) {
LAB_0014e994:
          pdStack_138 = (tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data;
          lVar31 = (long)(int)uVar23;
          U.
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
          .m_data = d;
          U.
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
          .m_rows.m_value = lVar31;
          if ((int)uVar23 < 0 && pdStack_138 != (double *)0x0) {
            pcVar19 = 
            "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, -1>, 1, Eigen::OuterStride<>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, -1>, 1, Eigen::OuterStride<>>, Level = 0]"
            ;
            goto LAB_0014f29b;
          }
          if (((ulong)pdStack_138 & 0xf) != 0) {
            __assert_fail("(!(internal::traits<Derived>::Flags&AlignedBit) || ((size_t(m_data) % 16) == 0)) && \"data is not aligned\""
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/MapBase.h"
                          ,0xa0,
                          "void Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, -1>, 1, Eigen::OuterStride<>>, 0>::checkSanity() const [Derived = Eigen::Map<Eigen::Matrix<double, -1, -1>, 1, Eigen::OuterStride<>>, Level = 0]"
                         );
          }
          iVar13 = (int)d;
          uVar12 = iVar13 + 1U & 0xfffffffe;
          U.
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value = (long)uVar12;
          pdVar18 = (PointerType)0x0;
          if (0 < iVar13) {
            pdVar18 = d;
          }
          iVar27 = iVar2 + 1;
          if (jcol < iVar11) {
            piVar17 = (repfnz->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            lVar36 = (repfnz->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage
                     .m_rows;
            pdVar7 = (dense->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data;
            lVar41 = (dense->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_rows;
            piVar8 = (glu->xlusup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data;
            lVar26 = (glu->xlusup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows;
            iVar33 = 0;
            lVar34 = lVar20;
            do {
              uVar22 = (lVar34 - lVar20) * (long)pdVar40;
              piVar9 = piVar17 + uVar22;
              if ((innerSize._4_4_ < 0) && (piVar9 != (int *)0x0)) goto LAB_0014f26f;
              if (((long)(uVar22 | (ulong)pdVar40) < 0) || (lVar36 - (long)pdVar40 < (long)uVar22))
              goto LAB_0014f258;
              pdVar10 = pdVar7 + uVar22;
              if ((innerSize._4_4_ < 0) && (pdVar10 != (double *)0x0)) goto LAB_0014f286;
              if (lVar41 - (long)pdVar40 < (long)uVar22) goto LAB_0014f2a5;
              if (innerSize._4_4_ <= iVar2) goto LAB_0014f241;
              iVar4 = piVar9[lVar28];
              if (iVar4 != -1) {
                if (lVar26 <= (long)uVar30) goto LAB_0014f1ec;
                innerSize._0_4_ = piVar8[uVar30];
                uVar35 = ~(iVar2 - iVar4) + iVar13;
                if (0 < (int)uVar35) {
                  if (((int)uVar23 <= iVar33) || (iVar33 < 0)) {
LAB_0014f222:
                    __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                                  ,0x151,
                                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double, -1, -1>, 1, Eigen::OuterStride<>>, 1>::operator()(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, -1>, 1, Eigen::OuterStride<>>, Level = 1]"
                                 );
                  }
                  pdVar32 = (PointerType)0x0;
                  do {
                    if (pdVar18 == pdVar32) goto LAB_0014f222;
                    pdStack_138
                    [(long)(iVar33 * U.
                                     super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
                                     .
                                     super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
                                     .m_cols.m_value + (long)pdVar32)] = 0.0;
                    pdVar32 = (PointerType)((long)pdVar32 + 1);
                  } while ((PointerType)(ulong)uVar35 != pdVar32);
                }
                if (-1 < iVar2 - iVar4) {
                  iVar39 = (lptr - iVar3) + iVar4;
                  piVar9 = (lsub->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                           m_storage.m_data;
                  lVar29 = (long)(int)uVar35;
                  lVar25 = (long)iVar39;
                  uVar22 = (ulong)(uint)(iVar27 - iVar4);
                  do {
                    if ((iVar39 < 0) ||
                       ((glu->lsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows <= lVar25)) goto LAB_0014f1ec;
                    iVar4 = piVar9[lVar25];
                    if (((long)iVar4 < 0) || (innerSize._4_4_ <= iVar4)) goto LAB_0014f203;
                    if (((((int)uVar35 < 0) || (iVar33 < 0)) || ((long)d <= lVar29)) ||
                       ((int)uVar23 <= iVar33)) goto LAB_0014f222;
                    pdStack_138
                    [iVar33 * U.
                              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
                              .
                              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
                              .m_cols.m_value + lVar29] = pdVar10[iVar4];
                    lVar25 = lVar25 + 1;
                    lVar29 = lVar29 + 1;
                    uVar22 = uVar22 - 1;
                  } while (uVar22 != 0);
                }
                iVar33 = iVar33 + 1;
              }
              lVar34 = lVar34 + 1;
            } while (lVar34 != local_188);
          }
          lVar36 = (glu->xlusup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          if ((long)uVar30 < lVar36) {
            piVar17 = (glu->xlusup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data;
            innerSize._0_4_ = piVar17[uVar30];
            if (lVar15 < lVar36) {
              lVar15 = (long)piVar17[uVar30 + 1] - (long)(int)innerSize;
              innerSize._0_4_ = ((int)lVar15 + 1) * (iVar27 - (iVar3 + iVar13)) + (int)innerSize;
              if ((int)lVar15 < 0) {
LAB_0014f2db:
                __assert_fail("innerStride>=0 && outerStride>=0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Stride.h"
                              ,0x40,
                              "Eigen::Stride<-1, 0>::Stride(Index, Index) [_OuterStrideAtCompileTime = -1, _InnerStrideAtCompileTime = 0]"
                             );
              }
              local_1b0 = (lusup->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                          m_storage.m_data + (int)innerSize;
              local_168 = (undefined1  [8])&local_1b0;
              local_1a8 = d;
              local_1a0 = d;
              local_198 = lVar15;
              dense_col.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
              super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
              m_data = pdStack_138;
              dense_col.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
              super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
              m_rows.m_value = (long)d;
              dense_col.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
              super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
              _16_8_ = lVar31;
              dense_col.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
              super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
              m_xpr = (Nested)U.
                              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
                              .
                              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
                              .m_cols.m_value;
              TriangularView<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,5u>
              ::
              solveInPlace<1,Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,Eigen::OuterStride<_1>>>
                        ((TriangularView<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,5u>
                          *)local_168,
                         (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>_>
                          *)&pdStack_138);
              lVar36 = (long)(int)innerSize;
              innerSize._0_4_ = (int)(iVar13 + lVar36);
              pdVar7 = (lusup->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data;
              if (-1 < (int)nrow || pdVar7 == (double *)0x0) {
                if ((tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_rows <= (long)(int)((uVar12 + nrow) * w + 1)) {
                  __assert_fail("tempv.size()>w*ldu + nrow*w + 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU_panel_bmod.h"
                                ,0x91,
                                "void Eigen::internal::SparseLUImpl<double, int>::panel_bmod(const Index, const Index, const Index, const Index, ScalarVector &, ScalarVector &, IndexVector &, IndexVector &, GlobalLU_t &) [Scalar = double, Index = int]"
                               );
                }
                pdVar7 = pdVar7 + iVar13 + lVar36;
                uVar35 = (((int)pdVar7 << 0x1c) >> 0x1f) + 2;
                if (((ulong)pdVar7 & 7) != 0) {
                  uVar35 = 0;
                }
                uVar14 = uVar35 - 2;
                if (uVar35 < 2) {
                  uVar14 = uVar35;
                }
                if ((int)nrow < -2) goto LAB_0014f2db;
                uVar22 = (ulong)(int)nrow;
                pdVar10 = (tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                          m_storage.m_data;
                if (-1 < (int)(uVar23 | nrow) || pdVar10 == (double *)0x0) {
                  if ((int)(uVar23 | nrow) < 0) {
                    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/CwiseNullaryOp.h"
                                  ,0x3f,
                                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Map<Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Map<Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>]"
                                 );
                  }
                  lVar26 = (long)(int)(uVar12 * w);
                  lVar36 = (long)(int)uVar14;
                  pdVar1 = pdVar10 + lVar26 + lVar36;
                  lVar41 = (long)(int)((nrow - ((int)(nrow + 1) >> 0x1f)) + 1 & 0xfffffffe);
                  if (0 < (int)uVar23) {
                    uVar30 = (ulong)((uint)((ulong)pdVar1 >> 3) & 1);
                    if ((long)uVar22 <= (long)uVar30) {
                      uVar30 = uVar22;
                    }
                    if (((ulong)pdVar1 & 7) != 0) {
                      uVar30 = uVar22;
                    }
                    pdVar37 = pdVar10 + lVar26 + lVar36;
                    __s = pdVar1;
                    lVar34 = lVar31;
                    do {
                      if (0 < (long)uVar30) {
                        memset(__s,0,uVar30 * 8);
                      }
                      uVar16 = uVar22 - uVar30 & 0xfffffffffffffffe;
                      lVar25 = uVar16 + uVar30;
                      if (0 < (long)uVar16) {
                        lVar29 = uVar30 + 2;
                        if ((long)(uVar30 + 2) < lVar25) {
                          lVar29 = lVar25;
                        }
                        memset(pdVar37 + uVar30,0,(~uVar30 + lVar29 & 0xfffffffffffffffe) * 8 + 0x10
                              );
                      }
                      if (lVar25 < (long)uVar22) {
                        uVar16 = (uVar22 - uVar30) * 8;
                        memset((void *)((uVar16 & 0xfffffffffffffff0) + uVar30 * 8 + (long)__s),0,
                               (ulong)((uint)uVar16 & 8));
                      }
                      uVar30 = (long)uVar30 % 2;
                      if ((long)uVar22 < (long)uVar30) {
                        uVar30 = uVar22;
                      }
                      pdVar37 = pdVar37 + lVar41;
                      __s = __s + lVar41;
                      lVar34 = lVar34 + -1;
                    } while (lVar34 != 0);
                  }
                  sparselu_gemm<double,long>
                            (uVar22,lVar31,(long)d,pdVar7,lVar15,pdStack_138,
                             U.
                             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
                             .
                             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
                             .m_cols.m_value,pdVar1,lVar41);
                  if (0 < w) {
                    piVar17 = (repfnz->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                              m_storage.m_data;
                    lVar15 = (repfnz->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                             m_storage.m_rows;
                    pdVar7 = (dense->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                             .m_storage.m_data;
                    lVar31 = (dense->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                             .m_storage.m_rows;
                    iVar33 = 0;
                    lVar34 = lVar20;
                    do {
                      uVar30 = (lVar34 - lVar20) * (long)pdVar40;
                      piVar8 = piVar17 + uVar30;
                      if ((innerSize._4_4_ < 0) && (piVar8 != (int *)0x0)) goto LAB_0014f26f;
                      if (((long)(uVar30 | (ulong)pdVar40) < 0) ||
                         (lVar15 - (long)pdVar40 < (long)uVar30)) goto LAB_0014f258;
                      pdVar1 = pdVar7 + uVar30;
                      if ((innerSize._4_4_ < 0) && (pdVar1 != (double *)0x0)) goto LAB_0014f286;
                      if (lVar31 - (long)pdVar40 < (long)uVar30) goto LAB_0014f2a5;
                      if (innerSize._4_4_ <= iVar2) goto LAB_0014f241;
                      iVar4 = piVar8[lVar28];
                      if (iVar4 != -1) {
                        iVar39 = (lptr - iVar3) + iVar4;
                        if (-1 < iVar2 - iVar4) {
                          lVar25 = U.
                                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
                                   .
                                   super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
                                   .m_cols.m_value * iVar33;
                          lVar29 = (long)(~(iVar2 - iVar4) + iVar13);
                          piVar8 = (lsub->
                                   super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                                   m_storage.m_data;
                          uVar30 = 0;
                          do {
                            if ((iVar39 < 0) ||
                               ((glu->lsub).
                                super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows <= (long)((long)iVar39 + uVar30)))
                            goto LAB_0014f1ec;
                            iVar5 = piVar8[(long)iVar39 + uVar30];
                            if (((long)iVar5 < 0) || (innerSize._4_4_ <= iVar5)) goto LAB_0014f203;
                            pdVar1[iVar5] = pdStack_138[lVar25 + lVar29 + uVar30];
                            pdStack_138[lVar25 + lVar29 + uVar30] = 0.0;
                            uVar30 = uVar30 + 1;
                          } while ((uint)(iVar27 - iVar4) != uVar30);
                          iVar39 = iVar39 + (int)uVar30;
                        }
                        if (0 < (int)nrow) {
                          piVar8 = (lsub->
                                   super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                                   m_storage.m_data;
                          lVar25 = (long)iVar33 * lVar41 * 8 + lVar26 * 8 + lVar36 * 8;
                          lVar29 = 0;
                          do {
                            if ((iVar39 < 0) ||
                               ((glu->lsub).
                                super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows <= iVar39 + lVar29)) goto LAB_0014f1ec;
                            iVar4 = piVar8[iVar39 + lVar29];
                            lVar38 = (long)iVar4;
                            if ((lVar38 < 0) || (innerSize._4_4_ <= iVar4)) goto LAB_0014f203;
                            pdVar1[lVar38] =
                                 pdVar1[lVar38] - *(double *)((long)pdVar10 + lVar29 * 8 + lVar25);
                            *(undefined8 *)((long)pdVar10 + lVar29 * 8 + lVar25) = 0;
                            lVar29 = lVar29 + 1;
                          } while (lVar29 < (long)uVar22);
                        }
                        iVar33 = iVar33 + 1;
                      }
                      lVar34 = lVar34 + 1;
                    } while (lVar34 < lVar21);
                  }
                  goto LAB_0014f1b7;
                }
              }
              pcVar19 = 
              "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>, Level = 0]"
              ;
              goto LAB_0014f29b;
            }
          }
          goto LAB_0014f1ec;
        }
        if (0 < w) {
          lVar36 = 0;
          uVar22 = 0;
          lVar41 = 0;
          lVar31 = lVar20;
          do {
            piVar17 = (repfnz->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            if ((innerSize._4_4_ < 0) && ((long)piVar17 + lVar41 != 0)) goto LAB_0014f26f;
            if (((long)(uVar22 | (ulong)pdVar40) < 0) ||
               ((repfnz->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows - (long)pdVar40 < (long)uVar22)) goto LAB_0014f258;
            local_168 = (undefined1  [8])
                        ((long)(dense->
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                               m_storage.m_data + lVar36);
            pMVar6 = (Nested)(dense->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                             .m_storage.m_rows;
            dense_col.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
            super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
            m_data = pdVar40;
            if ((innerSize._4_4_ < 0) && (local_168 != (undefined1  [8])0x0)) goto LAB_0014f286;
            uVar22 = uVar22 + (long)pdVar40;
            dense_col.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
            super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
            _16_8_ = dense;
            dense_col.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
            super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_xpr
                 = pMVar6;
            if ((long)pMVar6 - (long)pdVar40 < (long)(local_180 + uVar22)) goto LAB_0014f2a5;
            if (innerSize._4_4_ <= iVar2) goto LAB_0014f241;
            iVar13 = *(int *)((long)piVar17 + lVar41 + lVar28 * 4);
            if (iVar13 != -1) {
              lVar26 = (glu->xlusup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows;
              if (lVar26 <= (long)uVar30) goto LAB_0014f1ec;
              piVar17 = (glu->xlusup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data;
              innerSize._0_4_ = piVar17[uVar30];
              if (lVar26 <= lVar15) goto LAB_0014f1ec;
              iVar27 = iVar2 - iVar13;
              iVar33 = piVar17[uVar30 + 1] - (int)innerSize;
              iVar13 = iVar13 - iVar3;
              if (iVar27 == 2) {
                LU_kernel_bmod<3>::
                run<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
                          (3,(VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_168,
                           tempv,lusup,(int *)&innerSize,iVar33,nrow,lsub,lptr,iVar13);
              }
              else if (iVar27 == 1) {
                LU_kernel_bmod<2>::
                run<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
                          (2,(VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_168,
                           tempv,lusup,(int *)&innerSize,iVar33,nrow,lsub,lptr,iVar13);
              }
              else if (iVar27 == 0) {
                LU_kernel_bmod<1>::
                run<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
                          (1,(VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_168,
                           tempv,lusup,(int *)&innerSize,iVar33,nrow,lsub,lptr,iVar13);
              }
              else {
                LU_kernel_bmod<-1>::
                run<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
                          (iVar27 + 1,
                           (VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_168,
                           tempv,lusup,(int *)&innerSize,iVar33,nrow,lsub,lptr,iVar13);
              }
            }
            lVar41 = lVar41 + U.m_stride.super_Stride<_1,_0>._8_8_;
            lVar36 = lVar36 + local_178;
            lVar31 = lVar31 + 1;
          } while (lVar31 < lVar21);
        }
      }
LAB_0014f1b7:
      iVar24 = iVar24 + 1;
      uVar22 = local_170;
    } while (iVar24 != nseg);
  }
  return;
LAB_0014f203:
  pcVar19 = 
  "Scalar &Eigen::DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 1]"
  ;
  goto LAB_0014f218;
LAB_0014f26f:
  pcVar19 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>, Level = 0]"
  ;
  goto LAB_0014f29b;
LAB_0014f258:
  pcVar19 = 
  "Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<int, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
  goto LAB_0014f2ba;
LAB_0014f286:
  pcVar19 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
  ;
LAB_0014f29b:
  __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/MapBase.h"
                ,0x94,pcVar19);
LAB_0014f2a5:
  pcVar19 = 
  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_0014f2ba:
  __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Block.h"
                ,0x8d,pcVar19);
LAB_0014f241:
  pcVar19 = 
  "Scalar &Eigen::DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>, Level = 1]"
  ;
LAB_0014f218:
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                ,0x18a,pcVar19);
}

Assistant:

void SparseLUImpl<Scalar,Index>::panel_bmod(const Index m, const Index w, const Index jcol, 
                                            const Index nseg, ScalarVector& dense, ScalarVector& tempv,
                                            IndexVector& segrep, IndexVector& repfnz, GlobalLU_t& glu)
{
  
  Index ksub,jj,nextl_col; 
  Index fsupc, nsupc, nsupr, nrow; 
  Index krep, kfnz; 
  Index lptr; // points to the row subscripts of a supernode 
  Index luptr; // ...
  Index segsize,no_zeros ; 
  // For each nonz supernode segment of U[*,j] in topological order
  Index k = nseg - 1; 
  const Index PacketSize = internal::packet_traits<Scalar>::size;
  
  for (ksub = 0; ksub < nseg; ksub++)
  { // For each updating supernode
    /* krep = representative of current k-th supernode
     * fsupc =  first supernodal column
     * nsupc = number of columns in a supernode
     * nsupr = number of rows in a supernode
     */
    krep = segrep(k); k--; 
    fsupc = glu.xsup(glu.supno(krep)); 
    nsupc = krep - fsupc + 1; 
    nsupr = glu.xlsub(fsupc+1) - glu.xlsub(fsupc); 
    nrow = nsupr - nsupc; 
    lptr = glu.xlsub(fsupc); 
    
    // loop over the panel columns to detect the actual number of columns and rows
    Index u_rows = 0;
    Index u_cols = 0;
    for (jj = jcol; jj < jcol + w; jj++)
    {
      nextl_col = (jj-jcol) * m; 
      VectorBlock<IndexVector> repfnz_col(repfnz, nextl_col, m); // First nonzero column index for each row
      
      kfnz = repfnz_col(krep); 
      if ( kfnz == emptyIdxLU ) 
        continue; // skip any zero segment
      
      segsize = krep - kfnz + 1;
      u_cols++;
      u_rows = (std::max)(segsize,u_rows);
    }
    
    if(nsupc >= 2)
    { 
      Index ldu = internal::first_multiple<Index>(u_rows, PacketSize);
      Map<Matrix<Scalar,Dynamic,Dynamic>, Aligned,  OuterStride<> > U(tempv.data(), u_rows, u_cols, OuterStride<>(ldu));
      
      // gather U
      Index u_col = 0;
      for (jj = jcol; jj < jcol + w; jj++)
      {
        nextl_col = (jj-jcol) * m; 
        VectorBlock<IndexVector> repfnz_col(repfnz, nextl_col, m); // First nonzero column index for each row
        VectorBlock<ScalarVector> dense_col(dense, nextl_col, m); // Scatter/gather entire matrix column from/to here
        
        kfnz = repfnz_col(krep); 
        if ( kfnz == emptyIdxLU ) 
          continue; // skip any zero segment
        
        segsize = krep - kfnz + 1;
        luptr = glu.xlusup(fsupc);    
        no_zeros = kfnz - fsupc; 
        
        Index isub = lptr + no_zeros;
        Index off = u_rows-segsize;
        for (Index i = 0; i < off; i++) U(i,u_col) = 0;
        for (Index i = 0; i < segsize; i++)
        {
          Index irow = glu.lsub(isub); 
          U(i+off,u_col) = dense_col(irow); 
          ++isub; 
        }
        u_col++;
      }
      // solve U = A^-1 U
      luptr = glu.xlusup(fsupc);
      Index lda = glu.xlusup(fsupc+1) - glu.xlusup(fsupc);
      no_zeros = (krep - u_rows + 1) - fsupc;
      luptr += lda * no_zeros + no_zeros;
      Map<Matrix<Scalar,Dynamic,Dynamic>, 0, OuterStride<> > A(glu.lusup.data()+luptr, u_rows, u_rows, OuterStride<>(lda) );
      U = A.template triangularView<UnitLower>().solve(U);
      
      // update
      luptr += u_rows;
      Map<Matrix<Scalar,Dynamic,Dynamic>, 0, OuterStride<> > B(glu.lusup.data()+luptr, nrow, u_rows, OuterStride<>(lda) );
      eigen_assert(tempv.size()>w*ldu + nrow*w + 1);
      
      Index ldl = internal::first_multiple<Index>(nrow, PacketSize);
      Index offset = (PacketSize-internal::first_aligned(B.data(), PacketSize)) % PacketSize;
      Map<Matrix<Scalar,Dynamic,Dynamic>, 0, OuterStride<> > L(tempv.data()+w*ldu+offset, nrow, u_cols, OuterStride<>(ldl));
      
      L.setZero();
      internal::sparselu_gemm<Scalar>(L.rows(), L.cols(), B.cols(), B.data(), B.outerStride(), U.data(), U.outerStride(), L.data(), L.outerStride());
      
      // scatter U and L
      u_col = 0;
      for (jj = jcol; jj < jcol + w; jj++)
      {
        nextl_col = (jj-jcol) * m; 
        VectorBlock<IndexVector> repfnz_col(repfnz, nextl_col, m); // First nonzero column index for each row
        VectorBlock<ScalarVector> dense_col(dense, nextl_col, m); // Scatter/gather entire matrix column from/to here
        
        kfnz = repfnz_col(krep); 
        if ( kfnz == emptyIdxLU ) 
          continue; // skip any zero segment
        
        segsize = krep - kfnz + 1;
        no_zeros = kfnz - fsupc; 
        Index isub = lptr + no_zeros;
        
        Index off = u_rows-segsize;
        for (Index i = 0; i < segsize; i++)
        {
          Index irow = glu.lsub(isub++); 
          dense_col(irow) = U.coeff(i+off,u_col);
          U.coeffRef(i+off,u_col) = 0;
        }
        
        // Scatter l into SPA dense[]
        for (Index i = 0; i < nrow; i++)
        {
          Index irow = glu.lsub(isub++); 
          dense_col(irow) -= L.coeff(i,u_col);
          L.coeffRef(i,u_col) = 0;
        }
        u_col++;
      }
    }
    else // level 2 only
    {
      // Sequence through each column in the panel
      for (jj = jcol; jj < jcol + w; jj++)
      {
        nextl_col = (jj-jcol) * m; 
        VectorBlock<IndexVector> repfnz_col(repfnz, nextl_col, m); // First nonzero column index for each row
        VectorBlock<ScalarVector> dense_col(dense, nextl_col, m); // Scatter/gather entire matrix column from/to here
        
        kfnz = repfnz_col(krep); 
        if ( kfnz == emptyIdxLU ) 
          continue; // skip any zero segment
        
        segsize = krep - kfnz + 1;
        luptr = glu.xlusup(fsupc);
        
        Index lda = glu.xlusup(fsupc+1)-glu.xlusup(fsupc);// nsupr
        
        // Perform a trianglar solve and block update, 
        // then scatter the result of sup-col update to dense[]
        no_zeros = kfnz - fsupc; 
              if(segsize==1)  LU_kernel_bmod<1>::run(segsize, dense_col, tempv, glu.lusup, luptr, lda, nrow, glu.lsub, lptr, no_zeros);
        else  if(segsize==2)  LU_kernel_bmod<2>::run(segsize, dense_col, tempv, glu.lusup, luptr, lda, nrow, glu.lsub, lptr, no_zeros);
        else  if(segsize==3)  LU_kernel_bmod<3>::run(segsize, dense_col, tempv, glu.lusup, luptr, lda, nrow, glu.lsub, lptr, no_zeros);
        else                  LU_kernel_bmod<Dynamic>::run(segsize, dense_col, tempv, glu.lusup, luptr, lda, nrow, glu.lsub, lptr, no_zeros); 
      } // End for each column in the panel 
    }
    
  } // End for each updating supernode
}